

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

Var Js::JavascriptNumber::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  double dVar4;
  bool bVar5;
  int32 iVar6;
  BOOL BVar7;
  int iVar8;
  undefined4 *puVar9;
  Var pvVar10;
  JavascriptString *pJVar11;
  RecyclableObject *pRVar12;
  int in_stack_00000010;
  uint local_60;
  undefined4 uStack_5c;
  Type TStack_58;
  CallInfo local_50;
  CallInfo callInfo_local;
  Var result;
  double value;
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x33b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00b8ce02;
    *puVar9 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&value,&local_50,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_50 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x33e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00b8ce02;
    *puVar9 = 0;
  }
  if ((value._0_4_ & 0xffffff) != 0) {
    pvVar10 = Arguments::operator[]((Arguments *)&value,0);
    bVar5 = TaggedInt::Is(pvVar10);
    if (bVar5) {
      if ((value._0_4_ & 0xffffff) == 1) {
LAB_00b8ca2c:
        pvVar10 = Arguments::operator[]((Arguments *)&value,0);
        pJVar11 = ScriptContext::GetIntegerString(pSVar2,pvVar10);
        return pJVar11;
      }
      pvVar10 = Arguments::operator[]((Arguments *)&value,1);
      bVar5 = TaggedInt::Is(pvVar10);
      if (bVar5) {
        pvVar10 = Arguments::operator[]((Arguments *)&value,1);
        iVar6 = TaggedInt::ToInt32(pvVar10);
        if (iVar6 == 10) goto LAB_00b8ca2c;
      }
    }
    pvVar10 = Arguments::operator[]((Arguments *)&value,0);
    BVar7 = GetThisValue(pvVar10,(double *)&result);
    if (BVar7 != 0) {
      if ((value._0_4_ & 0xfffffe) != 0) {
        pvVar10 = Arguments::operator[]((Arguments *)&value,1);
        bVar5 = TaggedInt::Is(pvVar10);
        if (bVar5) {
          iVar8 = TaggedInt::ToInt32(pvVar10);
        }
        else {
          if (pvVar10 == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar9 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar5) goto LAB_00b8ce02;
            *puVar9 = 0;
          }
          bVar5 = TaggedInt::Is(pvVar10);
          if ((ulong)pvVar10 >> 0x32 == 0 && !bVar5) {
            pRVar12 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
            if (pRVar12 == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar9 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
              if (!bVar5) goto LAB_00b8ce02;
              *puVar9 = 0;
            }
            TVar1 = ((pRVar12->type).ptr)->typeId;
            if ((int)TVar1 < 0x58) {
              if (TVar1 == TypeIds_Undefined) goto LAB_00b8cd5f;
            }
            else {
              BVar7 = RecyclableObject::IsExternal(pRVar12);
              if (BVar7 == 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar9 = 1;
                bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar5) goto LAB_00b8ce02;
                *puVar9 = 0;
              }
            }
          }
          dVar4 = JavascriptConversion::ToInteger(pvVar10,pSVar2);
          iVar8 = (int)dVar4;
        }
        if (iVar8 != 10) {
          if (0xffffffdc < iVar8 - 0x25U) {
            pJVar11 = ToStringRadixHelper((double)result,iVar8,pSVar2);
            return pJVar11;
          }
          JavascriptError::ThrowRangeError(pSVar2,-0x7ff5ec37,L"Number.prototype.toString");
        }
      }
LAB_00b8cd5f:
      pJVar11 = ToStringRadix10((double)result,pSVar2);
      return pJVar11;
    }
    pvVar10 = Arguments::operator[]((Arguments *)&value,0);
    if (pvVar10 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00b8ce02;
      *puVar9 = 0;
    }
    bVar5 = TaggedInt::Is(pvVar10);
    if (((ulong)pvVar10 >> 0x32 != 0) || (bVar5)) goto LAB_00b8cdee;
    pRVar12 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
    if (pRVar12 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00b8ce02;
      *puVar9 = 0;
    }
    TVar1 = ((pRVar12->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        pvVar10 = Arguments::operator[]((Arguments *)&value,0);
        pRVar12 = VarTo<Js::RecyclableObject>(pvVar10);
        local_60 = value._0_4_;
        uStack_5c = value._4_4_;
        TStack_58._0_4_ = args.super_Arguments.Info._0_4_;
        TStack_58._4_4_ = args.super_Arguments.Info._4_4_;
        iVar8 = (*(pRVar12->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])
                          (pRVar12,EntryToString,&local_60,&callInfo_local);
        if (iVar8 != 0) {
          return (Var)callInfo_local;
        }
      }
    }
    else {
      BVar7 = RecyclableObject::IsExternal(pRVar12);
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar5) {
LAB_00b8ce02:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
    }
  }
LAB_00b8cdee:
  JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec3c,L"Number.prototype.toString");
}

Assistant:

Var JavascriptNumber::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toString"));
        }

        // Optimize base 10 of TaggedInt numbers
        if (TaggedInt::Is(args[0]) && (args.Info.Count == 1 || (TaggedInt::Is(args[1]) && TaggedInt::ToInt32(args[1]) == 10)))
        {
            return scriptContext->GetIntegerString(args[0]);
        }

        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToString, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toString"));
        }

        int radix = 10;
        if(args.Info.Count > 1)
        {
            //use the first arg as the radix, ignore the rest.
            Var aRadix = args[1];

           // shortcut for tagged int's
            if(TaggedInt::Is(aRadix))
            {
                radix = TaggedInt::ToInt32(aRadix);
            }
            else if(JavascriptOperators::GetTypeId(aRadix) != TypeIds_Undefined)
            {
                radix = (int)JavascriptConversion::ToInteger(aRadix,scriptContext);
            }

        }
        if(10 == radix)
        {
            return ToStringRadix10(value, scriptContext);
        }

        if( radix < 2 || radix >36 )
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_FunctionArgument_Invalid, _u("Number.prototype.toString"));
        }

        return ToStringRadixHelper(value, radix, scriptContext);
    }